

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O3

void __thiscall ObjLoader::NamedTextureImages::~NamedTextureImages(NamedTextureImages *this)

{
  size_t __n;
  int iVar1;
  _Hash_node_base *p_Var2;
  long *plVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>
  namedImage;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  _Hash_node_base *local_48;
  _Hash_node_base *p_Stack_40;
  _Hash_node_base *local_38;
  
  p_Var2 = (this->m_images)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,p_Var2[1]._M_nxt,
                 (long)&(p_Var2[1]._M_nxt)->_M_nxt + (long)&(p_Var2[2]._M_nxt)->_M_nxt);
      __n = local_60;
      plVar3 = local_68;
      local_38 = p_Var2[7]._M_nxt;
      local_48 = p_Var2[5]._M_nxt;
      p_Stack_40 = p_Var2[6]._M_nxt;
      if (local_60 == defaultDiffuseName_abi_cxx11_._M_string_length) {
        if (local_60 != 0) {
          iVar1 = bcmp(local_68,defaultDiffuseName_abi_cxx11_._M_dataplus._M_p,local_60);
          if (iVar1 != 0) goto LAB_0010e797;
        }
      }
      else {
LAB_0010e797:
        plVar3 = local_68;
        if (__n == defaultNormalName_abi_cxx11_._M_string_length) {
          if (__n != 0) {
            iVar1 = bcmp(local_68,defaultNormalName_abi_cxx11_._M_dataplus._M_p,__n);
            if (iVar1 != 0) goto LAB_0010e7bf;
          }
        }
        else {
LAB_0010e7bf:
          free(local_38);
          plVar3 = local_68;
        }
      }
      if (plVar3 != local_58) {
        operator_delete(plVar3,local_58[0] + 1);
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)this);
  return;
}

Assistant:

ObjLoader::NamedTextureImages::~NamedTextureImages()
{
  for (auto namedImage : m_images) {
    if (namedImage.first == defaultDiffuseName or namedImage.first == defaultNormalName) {
      continue;
    }
    unsigned char * imgData = namedImage.second.data;
    stbi_image_free(imgData);
  }
}